

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O0

void __thiscall
OpenMPVariantClause::generateDOT
          (OpenMPVariantClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  uint index_00;
  bool bVar1;
  char *pcVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar3;
  long lVar4;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
  *this_00;
  size_type sVar5;
  ulong uVar6;
  reference pvVar7;
  OpenMPDirective *pOVar8;
  allocator<char> local_15e1;
  string local_15e0;
  string local_15c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1140;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPClauseContextKind>
  *local_1120;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPClauseContextKind>
  *context_kind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1098;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ff8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  byte local_811;
  undefined1 local_810 [7];
  bool has_device;
  string local_7f0;
  uint local_7cc;
  undefined1 local_7c8 [4];
  uint i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  allocator<char> local_341;
  undefined1 local_340 [8];
  string node_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  OpenMPClauseKind local_11c;
  string local_118 [4];
  OpenMPClauseKind clause_kind;
  undefined1 local_f8 [8];
  string clause_type;
  string clause_string;
  allocator<char> local_a1;
  undefined1 local_a0 [8];
  string indent;
  string current_line;
  OpenMPDirective *variant_directive;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
  *parameter_pair_directives;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *parameter_pair_string;
  string parameter_string;
  string *parent_node_local;
  int index_local;
  int depth_local;
  ofstream *dot_file_local;
  OpenMPVariantClause *this_local;
  
  parameter_string.field_2._8_8_ = parent_node;
  std::__cxx11::string::string((string *)&parameter_pair_string);
  std::__cxx11::string::string((string *)(indent.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,(long)depth,'\t',&local_a1);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::string((string *)(clause_type.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_f8);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_118,(ulong)parent_node);
  std::__cxx11::string::operator=((string *)parent_node,local_118);
  std::__cxx11::string::~string(local_118);
  local_11c = OpenMPClause::getKind(&this->super_OpenMPClause);
  if (local_11c == OMPC_when) {
    std::__cxx11::string::operator=((string *)local_f8,"when");
  }
  else if (local_11c == OMPC_match) {
    std::__cxx11::string::operator=((string *)local_f8,"match");
  }
  else {
    std::operator<<((ostream *)&std::cout,"The variant clause is not supported.\n");
  }
  std::operator+(&local_1e0,parent_node,"_");
  std::operator+(&local_1c0,&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  std::operator+(&local_1a0,&local_1c0,"_");
  std::__cxx11::to_string(&local_200,depth);
  std::operator+(&local_180,&local_1a0,&local_200);
  std::operator+(&local_160,&local_180,"_");
  std::__cxx11::to_string(&local_220,index);
  std::operator+(&local_140,&local_160,&local_220);
  std::__cxx11::string::operator=
            ((string *)(clause_type.field_2._M_local_buf + 8),(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::operator+(&local_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 parent_node);
  std::operator+(&local_280,&local_2a0," -- ");
  std::operator+(&local_260,&local_280,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&clause_type.field_2 + 8));
  std::operator+(&local_240,&local_260,"\n");
  std::__cxx11::string::operator=((string *)(indent.field_2._M_local_buf + 8),(string *)&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::operator<<((ostream *)dot_file,pcVar2);
  std::__cxx11::string::operator+=((string *)local_a0,"\t");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&node_id.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&clause_type.field_2 + 8));
  std::operator+(&local_300,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&node_id.field_2 + 8)," [label = \"");
  std::operator+(&local_2e0,&local_300,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  std::operator+(&local_2c0,&local_2e0,"\"]\n");
  std::__cxx11::string::operator=((string *)(indent.field_2._M_local_buf + 8),(string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)(node_id.field_2._M_local_buf + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::operator<<((ostream *)dot_file,pcVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_340,"",&local_341);
  std::allocator<char>::~allocator(&local_341);
  ppVar3 = getUserCondition_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    std::operator+(&local_368,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&clause_type.field_2 + 8),"_user_condition");
    std::__cxx11::string::operator=((string *)local_340,(string *)&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::operator+(&local_3e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&clause_type.field_2 + 8));
    std::operator+(&local_3c8,&local_3e8," -- ");
    std::operator+(&local_3a8,&local_3c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_388,&local_3a8,"\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    std::operator+(&local_448,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "\t");
    std::operator+(&local_428,&local_448,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_408,&local_428," [label = \"user_condition\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_448);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    lVar4 = std::__cxx11::string::size();
    if (lVar4 != 0) {
      std::operator+(&local_4e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "\t");
      std::operator+(&local_4c8,&local_4e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_4a8,&local_4c8," -- ");
      std::operator+(&local_488,&local_4a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_468,&local_488,"_score\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_468);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_4e8);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar2);
      std::operator+(&local_588,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "\t\t");
      std::operator+(&local_568,&local_588,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_548,&local_568,"_score [label = \"score\\n ");
      std::operator+(&local_528,&local_548,&ppVar3->first);
      std::operator+(&local_508,&local_528,"\"]\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_508);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_588);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar2);
    }
    std::operator+(&local_628,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "\t");
    std::operator+(&local_608,&local_628,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_5e8,&local_608," -- ");
    std::operator+(&local_5c8,&local_5e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_5a8,&local_5c8,"_expr\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_5a8);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::__cxx11::string::~string((string *)&local_608);
    std::__cxx11::string::~string((string *)&local_628);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    std::operator+(&local_6c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "\t\t");
    std::operator+(&local_6a8,&local_6c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_688,&local_6a8,"_expr [label = \"expr\\n ");
    std::operator+(&local_668,&local_688,&ppVar3->second);
    std::operator+(&local_648,&local_668,"\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_648);
    std::__cxx11::string::~string((string *)&local_648);
    std::__cxx11::string::~string((string *)&local_668);
    std::__cxx11::string::~string((string *)&local_688);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::__cxx11::string::~string((string *)&local_6c8);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
  }
  this_00 = getConstructDirective_abi_cxx11_(this);
  sVar5 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
          ::size(this_00);
  if (sVar5 != 0) {
    std::operator+(&local_6e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&clause_type.field_2 + 8),"_construct");
    std::__cxx11::string::operator=((string *)local_340,(string *)&local_6e8);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::operator+(&local_768,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&clause_type.field_2 + 8));
    std::operator+(&local_748,&local_768," -- ");
    std::operator+(&local_728,&local_748,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_708,&local_728,"\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_708);
    std::__cxx11::string::~string((string *)&local_708);
    std::__cxx11::string::~string((string *)&local_728);
    std::__cxx11::string::~string((string *)&local_748);
    std::__cxx11::string::~string((string *)&local_768);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "\t");
    std::operator+(&local_7a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_788,&local_7a8," [label = \"construct\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_788);
    std::__cxx11::string::~string((string *)&local_788);
    std::__cxx11::string::~string((string *)&local_7a8);
    std::__cxx11::string::~string((string *)local_7c8);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    for (local_7cc = 0; uVar6 = (ulong)local_7cc,
        sVar5 = std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
                ::size(this_00), uVar6 < sVar5; local_7cc = local_7cc + 1) {
      pvVar7 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
               ::at(this_00,(ulong)local_7cc);
      index_00 = local_7cc;
      pOVar8 = pvVar7->second;
      std::__cxx11::string::string((string *)&local_7f0,(string *)local_340);
      pvVar7 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMPDirective_*>_>_>
               ::at(this_00,(ulong)local_7cc);
      std::__cxx11::string::string((string *)local_810,(string *)pvVar7);
      OpenMPDirective::generateDOT
                (pOVar8,dot_file,depth + 2,index_00,&local_7f0,(string *)local_810);
      std::__cxx11::string::~string((string *)local_810);
      std::__cxx11::string::~string((string *)&local_7f0);
    }
  }
  local_811 = 0;
  ppVar3 = getArchExpression_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    if ((local_811 & 1) == 0) {
      std::operator+(&local_838,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&clause_type.field_2 + 8),"_device");
      std::__cxx11::string::operator=((string *)local_340,(string *)&local_838);
      std::__cxx11::string::~string((string *)&local_838);
      std::operator+(&local_8b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&clause_type.field_2 + 8));
      std::operator+(&local_898,&local_8b8," -- ");
      std::operator+(&local_878,&local_898,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_858,&local_878,"\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_858);
      std::__cxx11::string::~string((string *)&local_858);
      std::__cxx11::string::~string((string *)&local_878);
      std::__cxx11::string::~string((string *)&local_898);
      std::__cxx11::string::~string((string *)&local_8b8);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar2);
      std::operator+(&local_918,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "\t");
      std::operator+(&local_8f8,&local_918,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_8d8,&local_8f8," [label = \"device\"]\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_8d8);
      std::__cxx11::string::~string((string *)&local_8d8);
      std::__cxx11::string::~string((string *)&local_8f8);
      std::__cxx11::string::~string((string *)&local_918);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar2);
      local_811 = 1;
    }
    std::operator+(&local_9b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "\t");
    std::operator+(&local_998,&local_9b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_978,&local_998," -- ");
    std::operator+(&local_958,&local_978,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_938,&local_958,"_arch\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_938);
    std::__cxx11::string::~string((string *)&local_938);
    std::__cxx11::string::~string((string *)&local_958);
    std::__cxx11::string::~string((string *)&local_978);
    std::__cxx11::string::~string((string *)&local_998);
    std::__cxx11::string::~string((string *)&local_9b8);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    std::operator+(&local_a18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "\t\t");
    std::operator+(&local_9f8,&local_a18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_9d8,&local_9f8,"_arch [label = \"arch\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_9d8);
    std::__cxx11::string::~string((string *)&local_9d8);
    std::__cxx11::string::~string((string *)&local_9f8);
    std::__cxx11::string::~string((string *)&local_a18);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    lVar4 = std::__cxx11::string::size();
    if (lVar4 != 0) {
      std::operator+(&local_ab8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "\t\t");
      std::operator+(&local_a98,&local_ab8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_a78,&local_a98,"_arch -- ");
      std::operator+(&local_a58,&local_a78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_a38,&local_a58,"_arch_score\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_a38);
      std::__cxx11::string::~string((string *)&local_a38);
      std::__cxx11::string::~string((string *)&local_a58);
      std::__cxx11::string::~string((string *)&local_a78);
      std::__cxx11::string::~string((string *)&local_a98);
      std::__cxx11::string::~string((string *)&local_ab8);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar2);
      std::operator+(&local_b58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "\t\t\t");
      std::operator+(&local_b38,&local_b58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_b18,&local_b38,"_arch_score [label = \"score\\n ");
      std::operator+(&local_af8,&local_b18,&ppVar3->first);
      std::operator+(&local_ad8,&local_af8,"\"]\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_ad8);
      std::__cxx11::string::~string((string *)&local_ad8);
      std::__cxx11::string::~string((string *)&local_af8);
      std::__cxx11::string::~string((string *)&local_b18);
      std::__cxx11::string::~string((string *)&local_b38);
      std::__cxx11::string::~string((string *)&local_b58);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar2);
    }
    std::operator+(&local_bf8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "\t\t");
    std::operator+(&local_bd8,&local_bf8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_bb8,&local_bd8,"_arch -- ");
    std::operator+(&local_b98,&local_bb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_b78,&local_b98,"_arch_expr\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_b78);
    std::__cxx11::string::~string((string *)&local_b78);
    std::__cxx11::string::~string((string *)&local_b98);
    std::__cxx11::string::~string((string *)&local_bb8);
    std::__cxx11::string::~string((string *)&local_bd8);
    std::__cxx11::string::~string((string *)&local_bf8);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    std::operator+(&local_c98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "\t\t\t");
    std::operator+(&local_c78,&local_c98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_c58,&local_c78,"_arch_expr [label = \"expr\\n ");
    std::operator+(&local_c38,&local_c58,&ppVar3->second);
    std::operator+(&local_c18,&local_c38,"\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_c18);
    std::__cxx11::string::~string((string *)&local_c18);
    std::__cxx11::string::~string((string *)&local_c38);
    std::__cxx11::string::~string((string *)&local_c58);
    std::__cxx11::string::~string((string *)&local_c78);
    std::__cxx11::string::~string((string *)&local_c98);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
  }
  ppVar3 = getIsaExpression_abi_cxx11_(this);
  bVar1 = std::operator!=(&ppVar3->second,"");
  if (bVar1) {
    if ((local_811 & 1) == 0) {
      std::operator+(&local_cb8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&clause_type.field_2 + 8),"_device");
      std::__cxx11::string::operator=((string *)local_340,(string *)&local_cb8);
      std::__cxx11::string::~string((string *)&local_cb8);
      std::operator+(&local_d38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&clause_type.field_2 + 8));
      std::operator+(&local_d18,&local_d38," -- ");
      std::operator+(&local_cf8,&local_d18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_cd8,&local_cf8,"\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_cd8);
      std::__cxx11::string::~string((string *)&local_cd8);
      std::__cxx11::string::~string((string *)&local_cf8);
      std::__cxx11::string::~string((string *)&local_d18);
      std::__cxx11::string::~string((string *)&local_d38);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar2);
      std::operator+(&local_d98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "\t");
      std::operator+(&local_d78,&local_d98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_d58,&local_d78," [label = \"device\"]\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_d58);
      std::__cxx11::string::~string((string *)&local_d58);
      std::__cxx11::string::~string((string *)&local_d78);
      std::__cxx11::string::~string((string *)&local_d98);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar2);
      local_811 = 1;
    }
    std::operator+(&local_e38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "\t");
    std::operator+(&local_e18,&local_e38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_df8,&local_e18," -- ");
    std::operator+(&local_dd8,&local_df8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_db8,&local_dd8,"_isa\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_db8);
    std::__cxx11::string::~string((string *)&local_db8);
    std::__cxx11::string::~string((string *)&local_dd8);
    std::__cxx11::string::~string((string *)&local_df8);
    std::__cxx11::string::~string((string *)&local_e18);
    std::__cxx11::string::~string((string *)&local_e38);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    std::operator+(&local_e98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "\t\t");
    std::operator+(&local_e78,&local_e98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_e58,&local_e78,"_isa [label = \"isa\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_e58);
    std::__cxx11::string::~string((string *)&local_e58);
    std::__cxx11::string::~string((string *)&local_e78);
    std::__cxx11::string::~string((string *)&local_e98);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    lVar4 = std::__cxx11::string::size();
    if (lVar4 != 0) {
      std::operator+(&local_f38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "\t\t");
      std::operator+(&local_f18,&local_f38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_ef8,&local_f18,"_isa -- ");
      std::operator+(&local_ed8,&local_ef8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_eb8,&local_ed8,"_isa_score\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_eb8);
      std::__cxx11::string::~string((string *)&local_eb8);
      std::__cxx11::string::~string((string *)&local_ed8);
      std::__cxx11::string::~string((string *)&local_ef8);
      std::__cxx11::string::~string((string *)&local_f18);
      std::__cxx11::string::~string((string *)&local_f38);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar2);
      std::operator+(&local_fd8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "\t\t\t");
      std::operator+(&local_fb8,&local_fd8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_f98,&local_fb8,"_isa_score [label = \"score\\n ");
      std::operator+(&local_f78,&local_f98,&ppVar3->first);
      std::operator+(&local_f58,&local_f78,"\"]\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_f58);
      std::__cxx11::string::~string((string *)&local_f58);
      std::__cxx11::string::~string((string *)&local_f78);
      std::__cxx11::string::~string((string *)&local_f98);
      std::__cxx11::string::~string((string *)&local_fb8);
      std::__cxx11::string::~string((string *)&local_fd8);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar2);
    }
    std::operator+(&local_1078,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "\t\t");
    std::operator+(&local_1058,&local_1078,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_1038,&local_1058,"_isa -- ");
    std::operator+(&local_1018,&local_1038,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_ff8,&local_1018,"_isa_expr\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_ff8);
    std::__cxx11::string::~string((string *)&local_ff8);
    std::__cxx11::string::~string((string *)&local_1018);
    std::__cxx11::string::~string((string *)&local_1038);
    std::__cxx11::string::~string((string *)&local_1058);
    std::__cxx11::string::~string((string *)&local_1078);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &context_kind,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "\t\t\t");
    std::operator+(&local_10f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &context_kind,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_10d8,&local_10f8,"_isa_expr [label = \"expr\\n ");
    std::operator+(&local_10b8,&local_10d8,&ppVar3->second);
    std::operator+(&local_1098,&local_10b8,"\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_1098);
    std::__cxx11::string::~string((string *)&local_1098);
    std::__cxx11::string::~string((string *)&local_10b8);
    std::__cxx11::string::~string((string *)&local_10d8);
    std::__cxx11::string::~string((string *)&local_10f8);
    std::__cxx11::string::~string((string *)&context_kind);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
  }
  std::__cxx11::string::clear();
  local_1120 = getContextKind_abi_cxx11_(this);
  switch(local_1120->second) {
  case OMPC_CONTEXT_KIND_host:
    std::__cxx11::string::operator=((string *)&parameter_pair_string,"host");
    break;
  case OMPC_CONTEXT_KIND_nohost:
    std::__cxx11::string::operator=((string *)&parameter_pair_string,"nohost");
    break;
  case OMPC_CONTEXT_KIND_any:
    std::__cxx11::string::operator=((string *)&parameter_pair_string,"any");
    break;
  case OMPC_CONTEXT_KIND_cpu:
    std::__cxx11::string::operator=((string *)&parameter_pair_string,"cpu");
    break;
  case OMPC_CONTEXT_KIND_gpu:
    std::__cxx11::string::operator=((string *)&parameter_pair_string,"gpu");
    break;
  case OMPC_CONTEXT_KIND_fpga:
    std::__cxx11::string::operator=((string *)&parameter_pair_string,"fpga");
    break;
  case OMPC_CONTEXT_KIND_unknown:
    break;
  default:
    std::operator<<((ostream *)&std::cout,"The context kind is not supported.\n");
  }
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    if ((local_811 & 1) == 0) {
      std::operator+(&local_1140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&clause_type.field_2 + 8),"_device");
      std::__cxx11::string::operator=((string *)local_340,(string *)&local_1140);
      std::__cxx11::string::~string((string *)&local_1140);
      std::operator+(&local_11c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&clause_type.field_2 + 8));
      std::operator+(&local_11a0,&local_11c0," -- ");
      std::operator+(&local_1180,&local_11a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_1160,&local_1180,"\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_1160);
      std::__cxx11::string::~string((string *)&local_1160);
      std::__cxx11::string::~string((string *)&local_1180);
      std::__cxx11::string::~string((string *)&local_11a0);
      std::__cxx11::string::~string((string *)&local_11c0);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar2);
      std::operator+(&local_1220,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "\t");
      std::operator+(&local_1200,&local_1220,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_11e0,&local_1200," [label = \"device\"]\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_11e0);
      std::__cxx11::string::~string((string *)&local_11e0);
      std::__cxx11::string::~string((string *)&local_1200);
      std::__cxx11::string::~string((string *)&local_1220);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar2);
      local_811 = 1;
    }
    std::operator+(&local_12c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "\t");
    std::operator+(&local_12a0,&local_12c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_1280,&local_12a0," -- ");
    std::operator+(&local_1260,&local_1280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_1240,&local_1260,"_kind\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_1240);
    std::__cxx11::string::~string((string *)&local_1240);
    std::__cxx11::string::~string((string *)&local_1260);
    std::__cxx11::string::~string((string *)&local_1280);
    std::__cxx11::string::~string((string *)&local_12a0);
    std::__cxx11::string::~string((string *)&local_12c0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    std::operator+(&local_1320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "\t\t");
    std::operator+(&local_1300,&local_1320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_12e0,&local_1300,"_kind [label = \"kind\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_12e0);
    std::__cxx11::string::~string((string *)&local_12e0);
    std::__cxx11::string::~string((string *)&local_1300);
    std::__cxx11::string::~string((string *)&local_1320);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    lVar4 = std::__cxx11::string::size();
    if (lVar4 != 0) {
      std::operator+(&local_13c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "\t\t");
      std::operator+(&local_13a0,&local_13c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_1380,&local_13a0,"_kind -- ");
      std::operator+(&local_1360,&local_1380,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_1340,&local_1360,"_kind_score\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_1340);
      std::__cxx11::string::~string((string *)&local_1340);
      std::__cxx11::string::~string((string *)&local_1360);
      std::__cxx11::string::~string((string *)&local_1380);
      std::__cxx11::string::~string((string *)&local_13a0);
      std::__cxx11::string::~string((string *)&local_13c0);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar2);
      std::operator+(&local_1460,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "\t\t\t");
      std::operator+(&local_1440,&local_1460,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      std::operator+(&local_1420,&local_1440,"_kind_score [label = \"score\\n ");
      std::operator+(&local_1400,&local_1420,&local_1120->first);
      std::operator+(&local_13e0,&local_1400,"\"]\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_13e0);
      std::__cxx11::string::~string((string *)&local_13e0);
      std::__cxx11::string::~string((string *)&local_1400);
      std::__cxx11::string::~string((string *)&local_1420);
      std::__cxx11::string::~string((string *)&local_1440);
      std::__cxx11::string::~string((string *)&local_1460);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar2);
    }
    std::operator+(&local_1500,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "\t\t");
    std::operator+(&local_14e0,&local_1500,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_14c0,&local_14e0,"_kind -- ");
    std::operator+(&local_14a0,&local_14c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_1480,&local_14a0,"_kind_value\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_1480);
    std::__cxx11::string::~string((string *)&local_1480);
    std::__cxx11::string::~string((string *)&local_14a0);
    std::__cxx11::string::~string((string *)&local_14c0);
    std::__cxx11::string::~string((string *)&local_14e0);
    std::__cxx11::string::~string((string *)&local_1500);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
    std::operator+(&local_15a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "\t\t\t");
    std::operator+(&local_1580,&local_15a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340);
    std::operator+(&local_1560,&local_1580,"_kind_value [label = \"");
    std::operator+(&local_1540,&local_1560,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &parameter_pair_string);
    std::operator+(&local_1520,&local_1540,"\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_1520);
    std::__cxx11::string::~string((string *)&local_1520);
    std::__cxx11::string::~string((string *)&local_1540);
    std::__cxx11::string::~string((string *)&local_1560);
    std::__cxx11::string::~string((string *)&local_1580);
    std::__cxx11::string::~string((string *)&local_15a0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar2);
  }
  if ((local_11c == OMPC_when) &&
     (pOVar8 = OpenMPWhenClause::getVariantDirective((OpenMPWhenClause *)this),
     pOVar8 != (OpenMPDirective *)0x0)) {
    std::__cxx11::string::string
              ((string *)&local_15c0,(string *)(clause_type.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_15e0,"",&local_15e1);
    OpenMPDirective::generateDOT(pOVar8,dot_file,depth + 1,0,&local_15c0,&local_15e0);
    std::__cxx11::string::~string((string *)&local_15e0);
    std::allocator<char>::~allocator(&local_15e1);
    std::__cxx11::string::~string((string *)&local_15c0);
  }
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)(clause_type.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)(indent.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&parameter_pair_string);
  return;
}

Assistant:

void OpenMPVariantClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string parameter_string;
    std::pair<std::string, std::string>* parameter_pair_string;
    std::vector<std::pair<std::string, OpenMPDirective*> >* parameter_pair_directives;
    OpenMPDirective* variant_directive = NULL;

/*

    // check implementation
    clause_string.clear();
    parameter_string.clear();
    // check implementation vendor
    OpenMPClauseContextVendor context_vendor = this->getImplementationKind();
    switch (context_vendor) {
        case OMPC_CONTEXT_VENDOR_amd:
            parameter_string = "amd";
            break;
        case OMPC_CONTEXT_VENDOR_arm:
            parameter_string = "arm";
            break;
        case OMPC_CONTEXT_VENDOR_bsc:
            parameter_string = "bsc";
            break;
        case OMPC_CONTEXT_VENDOR_cray:
            parameter_string = "cray";
            break;
        case OMPC_CONTEXT_VENDOR_fujitsu:
            parameter_string = "fujitsu";
            break;
        case OMPC_CONTEXT_VENDOR_gnu:
            parameter_string = "gnu";
            break;
        case OMPC_CONTEXT_VENDOR_ibm:
            parameter_string = "ibm";
            break;
        case OMPC_CONTEXT_VENDOR_intel:
            parameter_string = "intel";
            break;
        case OMPC_CONTEXT_VENDOR_llvm:
            parameter_string = "llvm";
            break;
        case OMPC_CONTEXT_VENDOR_pgi:
            parameter_string = "pgi";
            break;
        case OMPC_CONTEXT_VENDOR_ti:
            parameter_string = "ti";
            break;
        case OMPC_CONTEXT_VENDOR_unknown:
            parameter_string = "unknown";
            break;
        case OMPC_CONTEXT_VENDOR_unspecified:
            break;
        default:
            std::cout << "The context vendor is not supported.\n";
    };
    if (parameter_string.size() > 0) {
        clause_string += "vendor(" + parameter_string + "), ";
    };

    // check implementation extension
    parameter_string = this->getExtensionExpression();
    if (parameter_string.size() > 0) {
        clause_string += "extension(" + parameter_string + "), ";
    };

    if (clause_string.size() > 0) {
        result += "implementation = {" + clause_string.substr(0, clause_string.size()-2) + "}, ";
    };

    clause_string.clear();
    result = result.substr(0, result.size()-2);



    result += clause_string + ") ";

    //return result;*/
    std::string current_line;
    std::string indent = std::string(depth, '\t');
    std::string clause_string;
    std::string clause_type;
    //std::vector<OpenMPDirective*>* parameter_directives;
    parent_node = parent_node.substr(0, parent_node.size()-1);
    OpenMPClauseKind clause_kind = this->getKind();
    switch (clause_kind) {
        case OMPC_when:
            clause_type = "when";
            break;
        case OMPC_match:
            clause_type = "match";
            break;
        default:
            std::cout << "The variant clause is not supported.\n";
    };
    clause_string = parent_node + "_" + clause_type + "_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + " -- " + clause_string + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    current_line = indent + clause_string + " [label = \"" + clause_type + "\"]\n";
    dot_file << current_line.c_str();

    std::string node_id = "";
    // check user
    parameter_pair_string = this->getUserCondition();
    if (parameter_pair_string->second.size() > 0) {
        node_id = clause_string + "_user_condition";
        current_line = indent + clause_string + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"user_condition\"]\n";
        dot_file << current_line.c_str();
        // output score
        if (parameter_pair_string->first.size() > 0) {
            current_line = indent + "\t" + node_id + " -- " + node_id + "_score\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t\t" + node_id + "_score [label = \"score\\n " + parameter_pair_string->first + "\"]\n";
            dot_file << current_line.c_str();
        };
        // output condition expression
        current_line = indent + "\t" + node_id + " -- " + node_id + "_expr\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t" + node_id + "_expr [label = \"expr\\n " + parameter_pair_string->second + "\"]\n";
        dot_file << current_line.c_str();
    };

    // check construct
    parameter_pair_directives = this->getConstructDirective();
    if (parameter_pair_directives->size() != 0) {
        node_id = clause_string + "_construct";
        current_line = indent + clause_string + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"construct\"]\n";
        dot_file << current_line.c_str();
        for (unsigned int i = 0; i < parameter_pair_directives->size(); i++) {
            parameter_pair_directives->at(i).second->generateDOT(dot_file, depth+2, i, node_id, parameter_pair_directives->at(i).first);
        };
    };

    // check device_arch
    bool has_device = false;
    parameter_pair_string = this->getArchExpression();
    if (parameter_pair_string->second.size() > 0) {
        if (!has_device) {
            node_id = clause_string + "_device";
            current_line = indent + clause_string + " -- " + node_id + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"device\"]\n";
            dot_file << current_line.c_str();
            has_device = true;
        };
        current_line = indent + "\t" + node_id + " -- " + node_id + "_arch\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t" + node_id + "_arch [label = \"arch\"]\n";
        dot_file << current_line.c_str();
        // output score
        if (parameter_pair_string->first.size() > 0 ) {
            current_line = indent + "\t\t" + node_id + "_arch -- " + node_id + "_arch_score\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t\t\t" + node_id + "_arch_score [label = \"score\\n " + parameter_pair_string->first + "\"]\n";
            dot_file << current_line.c_str();
        };
        // output arch expression
        current_line = indent + "\t\t" + node_id + "_arch -- " + node_id + "_arch_expr\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t\t" + node_id + "_arch_expr [label = \"expr\\n " + parameter_pair_string->second + "\"]\n";
        dot_file << current_line.c_str();
    };

    // check device_isa
    parameter_pair_string = this->getIsaExpression();
    if (parameter_pair_string->second != "") {
        if (!has_device) {
            node_id = clause_string + "_device";
            current_line = indent + clause_string + " -- " + node_id + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"device\"]\n";
            dot_file << current_line.c_str();
            has_device = true;
        };
        current_line = indent + "\t" + node_id + " -- " + node_id + "_isa\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t" + node_id + "_isa [label = \"isa\"]\n";
        dot_file << current_line.c_str();
        // output score
        if (parameter_pair_string->first.size() > 0) {
            current_line = indent + "\t\t" + node_id + "_isa -- " + node_id + "_isa_score\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t\t\t" + node_id + "_isa_score [label = \"score\\n " + parameter_pair_string->first + "\"]\n";
            dot_file << current_line.c_str();
        };
        // output isa expression
        current_line = indent + "\t\t" + node_id + "_isa -- " + node_id + "_isa_expr\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t\t" + node_id + "_isa_expr [label = \"expr\\n " + parameter_pair_string->second + "\"]\n";
        dot_file << current_line.c_str();
    };

    // check device_kind
    parameter_string.clear();
    std::pair<std::string, OpenMPClauseContextKind>* context_kind = this->getContextKind();
    switch (context_kind->second) {
        case OMPC_CONTEXT_KIND_host:
            parameter_string = "host";
            break;
        case OMPC_CONTEXT_KIND_nohost:
            parameter_string = "nohost";
            break;
        case OMPC_CONTEXT_KIND_any:
            parameter_string = "any";
            break;
        case OMPC_CONTEXT_KIND_cpu:
            parameter_string = "cpu";
            break;
        case OMPC_CONTEXT_KIND_gpu:
            parameter_string = "gpu";
            break;
        case OMPC_CONTEXT_KIND_fpga:
            parameter_string = "fpga";
            break;
        case OMPC_CONTEXT_KIND_unknown:
            break;
        default:
            std::cout << "The context kind is not supported.\n";
    };

    if (parameter_string.size() > 0) {
        if (!has_device) {
            node_id = clause_string + "_device";
            current_line = indent + clause_string + " -- " + node_id + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + node_id + " [label = \"device\"]\n";
            dot_file << current_line.c_str();
            has_device = true;
        };
        current_line = indent + "\t" + node_id + " -- " + node_id + "_kind\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t" + node_id + "_kind [label = \"kind\"]\n";
        dot_file << current_line.c_str();
        // output score
        if (context_kind->first.size() > 0) {
            current_line = indent + "\t\t" + node_id + "_kind -- " + node_id + "_kind_score\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t\t\t" + node_id + "_kind_score [label = \"score\\n " + context_kind->first + "\"]\n";
            dot_file << current_line.c_str();
        };
        // output kind value
        current_line = indent + "\t\t" + node_id + "_kind -- " + node_id + "_kind_value\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t\t\t" + node_id + "_kind_value [label = \"" + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };

    if (clause_kind == OMPC_when) {
        variant_directive = ((OpenMPWhenClause*)this)->getVariantDirective();
        if (variant_directive != NULL) {
            variant_directive->generateDOT(dot_file, depth+1, 0, clause_string, "");
        };
    };
}